

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cni.hpp
# Opt level: O0

any __thiscall
cs_impl::
cni_helper<bool_(*)(const_std::deque<cs_impl::any,_std::allocator<cs_impl::any>_>_&),_bool_(*)(const_std::deque<cs_impl::any,_std::allocator<cs_impl::any>_>_&)>
::call(cni_helper<bool_(*)(const_std::deque<cs_impl::any,_std::allocator<cs_impl::any>_>_&),_bool_(*)(const_std::deque<cs_impl::any,_std::allocator<cs_impl::any>_>_&)>
       *this,vector *args)

{
  size_type sVar1;
  runtime_error *this_00;
  vector<cs_impl::any,_std::allocator<cs_impl::any>_> *in_RDX;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_RDI;
  string *in_stack_ffffffffffffff08;
  sequence<0> *in_stack_ffffffffffffff10;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *this_01;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffff40;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffff48;
  
  this_01 = in_RDI;
  sVar1 = std::vector<cs_impl::any,_std::allocator<cs_impl::any>_>::size(in_RDX);
  if (sVar1 != 1) {
    this_00 = (runtime_error *)__cxa_allocate_exception(0x28);
    std::__cxx11::to_string((unsigned_long)in_stack_ffffffffffffff48);
    std::operator+((char *)in_RDI,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)this_00);
    std::operator+(in_RDI,(char *)this_00);
    std::vector<cs_impl::any,_std::allocator<cs_impl::any>_>::size(in_RDX);
    std::__cxx11::to_string((unsigned_long)in_stack_ffffffffffffff48);
    std::operator+(in_stack_ffffffffffffff48,in_stack_ffffffffffffff40);
    cs::runtime_error::runtime_error(this_00,in_stack_ffffffffffffff08);
    __cxa_throw(this_00,&cs::runtime_error::typeinfo,cs::runtime_error::~runtime_error);
  }
  _call<0>((cni_helper<bool_(*)(const_std::deque<cs_impl::any,_std::allocator<cs_impl::any>_>_&),_bool_(*)(const_std::deque<cs_impl::any,_std::allocator<cs_impl::any>_>_&)>
            *)this_01,(vector *)in_RDI,in_stack_ffffffffffffff10);
  return_to_cs<bool>((bool *)in_stack_ffffffffffffff08);
  return (any)(proxy *)this_01;
}

Assistant:

any call(cs::vector &args) const
		{
			if (args.size() != sizeof...(_Target_ArgsT))
				throw cs::runtime_error(
				    "Wrong size of the arguments. Expected " + std::to_string(sizeof...(_Target_ArgsT)) +
				    ", provided " +
				    std::to_string(args.size()));
			return return_to_cs(_call(args, cov::make_sequence<sizeof...(_Source_ArgsT)>::result));
		}